

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O0

void __thiscall QProcess::setUnixProcessParameters(QProcess *this,UnixProcessFlags flagsOnly)

{
  bool bVar1;
  pointer pUVar2;
  Int in_ESI;
  long in_FS_OFFSET;
  QProcessPrivate *d;
  pointer in_stack_ffffffffffffff98;
  UnixExtras *in_stack_ffffffffffffffa0;
  quint32 *local_58;
  quint32 aqStack_20 [4];
  quint32 qStack_10;
  quint32 qStack_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QProcess *)0x7911a9);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<QProcessPrivate::UnixExtras,_std::default_delete<QProcessPrivate::UnixExtras>_>
                      *)0x7911bf);
  if (!bVar1) {
    operator_new(0x40);
    QProcessPrivate::UnixExtras::UnixExtras(in_stack_ffffffffffffffa0);
    std::unique_ptr<QProcessPrivate::UnixExtras,_std::default_delete<QProcessPrivate::UnixExtras>_>
    ::reset((unique_ptr<QProcessPrivate::UnixExtras,_std::default_delete<QProcessPrivate::UnixExtras>_>
             *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  }
  local_58 = aqStack_20;
  do {
    *local_58 = 0;
    local_58 = local_58 + 1;
  } while (local_58 != (quint32 *)&local_8);
  pUVar2 = std::
           unique_ptr<QProcessPrivate::UnixExtras,_std::default_delete<QProcessPrivate::UnixExtras>_>
           ::operator->((unique_ptr<QProcessPrivate::UnixExtras,_std::default_delete<QProcessPrivate::UnixExtras>_>
                         *)0x791252);
  (pUVar2->processParameters)._reserved[2] = aqStack_20[2];
  (pUVar2->processParameters)._reserved[3] = aqStack_20[3];
  (pUVar2->processParameters)._reserved[4] = qStack_10;
  (pUVar2->processParameters)._reserved[5] = qStack_c;
  (pUVar2->processParameters).flags.super_QFlagsStorageHelper<QProcess::UnixProcessFlag,_4>.
  super_QFlagsStorage<QProcess::UnixProcessFlag>.i = in_ESI;
  (pUVar2->processParameters).lowestFileDescriptorToClose = 0;
  (pUVar2->processParameters)._reserved[0] = aqStack_20[0];
  (pUVar2->processParameters)._reserved[1] = aqStack_20[1];
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QProcess::setUnixProcessParameters(UnixProcessFlags flagsOnly)
{
    Q_D(QProcess);
    if (!d->unixExtras)
        d->unixExtras.reset(new QProcessPrivate::UnixExtras);
    d->unixExtras->processParameters = { flagsOnly };
}